

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  SPIRType *pSVar4;
  CompilerError *this_00;
  char *__rhs;
  string *in_R8;
  char (*in_R9) [2];
  undefined2 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70a;
  undefined1 in_stack_fffffffffffff70b;
  undefined1 in_stack_fffffffffffff70c;
  undefined1 in_stack_fffffffffffff70d;
  undefined1 in_stack_fffffffffffff70e;
  undefined1 in_stack_fffffffffffff70f;
  bool local_8f0;
  bool local_8ee;
  bool local_8ec;
  bool local_8ea;
  bool local_8d2;
  byte local_8c1;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  string local_598;
  undefined1 local_578 [8];
  SPIRType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  string local_2d8;
  string local_2b8;
  byte local_291;
  undefined1 local_290 [7];
  bool workaround_lod_array_shadow_as_grad;
  undefined1 local_270 [8];
  SPIRType expected_type;
  SPIRType *coord_type;
  string local_100;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  char *swizzle_expr;
  undefined1 local_b0 [5];
  bool forward;
  anon_class_1_1_ecf36ffc swizzle;
  bool swizz_func;
  string local_90;
  string local_60;
  byte local_39;
  SPIRType *local_38;
  SPIRType *imgtype;
  bool *pbStack_28;
  VariableID img;
  bool *p_forward_local;
  TextureFunctionArguments *args_local;
  CompilerGLSL *this_local;
  string *farg_str;
  
  imgtype._4_4_ = (args->base).img.id;
  local_38 = (args->base).imgtype;
  local_39 = 0;
  pbStack_28 = p_forward;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (((args->base).is_fetch & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    to_non_uniform_aware_expression_abi_cxx11_(&local_90,this,uVar2);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    convert_separate_image_to_expression_abi_cxx11_(&local_60,this,uVar2);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
  }
  if (((args->nonuniform_expression & 1U) != 0) &&
     (lVar3 = ::std::__cxx11::string::find_first_of((char)__return_storage_ptr__,0x5b), lVar3 != -1)
     ) {
    in_R8 = (string *)0x5b7d4b;
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              ((string *)local_b0,(spirv_cross *)&(this->backend).nonuniform_qualifier,
               (char **)0x5ac375,(char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_b0);
    ::std::__cxx11::string::~string((string *)local_b0);
  }
  swizzle_expr._6_1_ = (this->backend).swizzle_is_function & 1;
  swizzle_expr._7_1_ = swizzle_expr._6_1_;
  swizzle_expr._5_1_ = should_forward(this,args->coord);
  uVar2 = args->coord_components;
  pSVar4 = Compiler::expression_type(&this->super_Compiler,args->coord);
  coord_expr.field_2._8_8_ =
       to_function_args::anon_class_1_1_ecf36ffc::operator()
                 ((anon_class_1_1_ecf36ffc *)((long)&swizzle_expr + 6),uVar2,pSVar4->vecsize);
  if (*(char *)coord_expr.field_2._8_8_ == '\0') {
    to_expression_abi_cxx11_((string *)local_e0,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_(&local_100,this,args->coord,true);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_100,(char *)coord_expr.field_2._8_8_);
    ::std::__cxx11::string::~string((string *)&local_100);
  }
  expected_type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::expression_type(&this->super_Compiler,args->coord);
  if (((SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket)->basetype == UInt) {
    SPIRType::SPIRType((SPIRType *)local_270,
                       (SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
    expected_type.basetype = args->coord_components;
    expected_type.super_IVariant.self.id = 7;
    in_R8 = (string *)local_e0;
    bitcast_expression((string *)local_290,this,(SPIRType *)local_270,
                       *(BaseType *)&expected_type.member_name_cache._M_h._M_single_bucket[2]._M_nxt
                       ,in_R8);
    ::std::__cxx11::string::operator=((string *)local_e0,(string *)local_290);
    ::std::__cxx11::string::~string((string *)local_290);
    SPIRType::~SPIRType((SPIRType *)local_270);
  }
  pSVar4 = local_38;
  if (((((local_38->image).arrayed & 1U) != 0) && ((local_38->image).dim == Dim2D)) ||
     (local_8c1 = 0, (local_38->image).dim == Cube)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&imgtype + 4));
    bVar1 = Compiler::is_depth_image(&this->super_Compiler,pSVar4,uVar2);
    local_8c1 = 0;
    if ((bVar1) && (local_8c1 = 0, args->lod != 0)) {
      local_8c1 = (args->base).is_fetch ^ 0xff;
    }
  }
  local_291 = local_8c1 & 1;
  if (args->dref == 0) {
    if (((local_38->image).dim == Dim1D) && (((this->options).es & 1U) != 0)) {
      bVar1 = type_is_floating_point
                        ((SPIRType *)expected_type.member_name_cache._M_h._M_single_bucket);
      if (bVar1) {
        if ((((local_38->image).arrayed & 1U) == 0) && (((args->base).is_proj & 1U) == 0)) {
          join<char_const(&)[6],std::__cxx11::string&,char_const(&)[7]>
                    (&local_6b8,(spirv_cross *)0x5b640f,(char (*) [6])local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", 0.0)",
                     (char (*) [7])in_R8);
          ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_6b8);
          ::std::__cxx11::string::~string((string *)&local_6b8);
        }
        else {
          enclose_expression(&local_678,this,(string *)local_e0);
          enclose_expression(&local_698,this,(string *)local_e0);
          join<char_const(&)[6],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char_const(&)[4]>
                    (&local_658,(spirv_cross *)0x5b47cf,(char (*) [6])&local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ".x, 0.0, ",(char (*) [10])&local_698,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59864e,
                     (char (*) [4])
                     CONCAT17(in_stack_fffffffffffff70f,
                              CONCAT16(in_stack_fffffffffffff70e,
                                       CONCAT15(in_stack_fffffffffffff70d,
                                                CONCAT14(in_stack_fffffffffffff70c,
                                                         CONCAT13(in_stack_fffffffffffff70b,
                                                                  CONCAT12(in_stack_fffffffffffff70a
                                                                           ,
                                                  in_stack_fffffffffffff708)))))));
          ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_658);
          ::std::__cxx11::string::~string((string *)&local_658);
          ::std::__cxx11::string::~string((string *)&local_698);
          ::std::__cxx11::string::~string((string *)&local_678);
        }
      }
      else if (((local_38->image).arrayed & 1U) == 0) {
        join<char_const(&)[7],std::__cxx11::string&,char_const(&)[5]>
                  (&local_738,(spirv_cross *)"ivec2(",(char (*) [7])local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b682f,
                   (char (*) [5])in_R8);
        ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_738);
        ::std::__cxx11::string::~string((string *)&local_738);
      }
      else {
        enclose_expression(&local_6f8,this,(string *)local_e0);
        enclose_expression(&local_718,this,(string *)local_e0);
        join<char_const(&)[7],std::__cxx11::string,char_const(&)[8],std::__cxx11::string,char_const(&)[4]>
                  (&local_6d8,(spirv_cross *)"ivec3(",(char (*) [7])&local_6f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x, 0, ",
                   (char (*) [8])&local_718,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x59864e,
                   (char (*) [4])
                   CONCAT17(in_stack_fffffffffffff70f,
                            CONCAT16(in_stack_fffffffffffff70e,
                                     CONCAT15(in_stack_fffffffffffff70d,
                                              CONCAT14(in_stack_fffffffffffff70c,
                                                       CONCAT13(in_stack_fffffffffffff70b,
                                                                CONCAT12(in_stack_fffffffffffff70a,
                                                                         in_stack_fffffffffffff708))
                                                      )))));
        ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_6d8);
        ::std::__cxx11::string::~string((string *)&local_6d8);
        ::std::__cxx11::string::~string((string *)&local_718);
        ::std::__cxx11::string::~string((string *)&local_6f8);
      }
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_e0);
  }
  else {
    local_8d2 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_8d2 = should_forward(this,args->dref);
    }
    swizzle_expr._5_1_ = local_8d2;
    if ((((args->base).is_gather & 1U) == 0) && (args->coord_components != 4)) {
      if (((args->base).is_proj & 1U) == 0) {
        pSVar4 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType((SPIRType *)local_578,pSVar4);
        type.basetype = args->coord_components + Void;
        if (((local_38->image).dim == Dim1D) && (((this->options).es & 1U) != 0)) {
          type.basetype = args->coord_components + Boolean;
        }
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        type_to_glsl_constructor_abi_cxx11_(&local_598,this,(SPIRType *)local_578);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_598);
        ::std::__cxx11::string::~string((string *)&local_598);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(");
        if (((local_38->image).dim == Dim1D) && (((this->options).es & 1U) != 0)) {
          if (((local_38->image).arrayed & 1U) == 0) {
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_e0);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", 0.0");
          }
          else {
            enclose_expression(&local_5d8,this,(string *)local_e0);
            ::std::operator+(&local_5b8,&local_5d8,".x");
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_5b8);
            ::std::__cxx11::string::~string((string *)&local_5b8);
            ::std::__cxx11::string::~string((string *)&local_5d8);
            ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", 0.0, ");
            enclose_expression(&local_618,this,(string *)local_e0);
            ::std::operator+(&local_5f8,&local_618,".y");
            ::std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,(string *)&local_5f8);
            ::std::__cxx11::string::~string((string *)&local_5f8);
            ::std::__cxx11::string::~string((string *)&local_618);
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_e0);
        }
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        to_expression_abi_cxx11_(&local_638,this,args->dref,true);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_638);
        ::std::__cxx11::string::~string((string *)&local_638);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
        SPIRType::~SPIRType((SPIRType *)local_578);
      }
      else {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", vec4(");
        if ((local_38->image).dim == Dim1D) {
          to_enclosed_expression_abi_cxx11_(&local_318,this,args->coord,true);
          ::std::operator+(&local_2f8,&local_318,".x");
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2f8);
          ::std::__cxx11::string::~string((string *)&local_2f8);
          ::std::__cxx11::string::~string((string *)&local_318);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"0.0, ");
          to_expression_abi_cxx11_(&local_338,this,args->dref,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_338);
          ::std::__cxx11::string::~string((string *)&local_338);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          to_enclosed_expression_abi_cxx11_(&local_378,this,args->coord,true);
          ::std::operator+(&local_358,&local_378,".y)");
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_378);
        }
        else {
          if ((local_38->image).dim != Dim2D) {
            this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(this_00,"Invalid type for textureProj with shadow.");
            __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          to_enclosed_expression_abi_cxx11_(&local_3b8,this,args->coord,true);
          __rhs = ".xy";
          if ((swizzle_expr._7_1_ & 1) != 0) {
            __rhs = ".xy()";
          }
          ::std::operator+(&local_398,&local_3b8,__rhs);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_398);
          ::std::__cxx11::string::~string((string *)&local_398);
          ::std::__cxx11::string::~string((string *)&local_3b8);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          to_expression_abi_cxx11_(&local_3d8,this,args->dref,true);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3d8);
          ::std::__cxx11::string::~string((string *)&local_3d8);
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          to_enclosed_expression_abi_cxx11_
                    ((string *)&type.member_name_cache._M_h._M_single_bucket,this,args->coord,true);
          ::std::operator+(&local_3f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &type.member_name_cache._M_h._M_single_bucket,".z)");
          ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3f8);
          ::std::__cxx11::string::~string((string *)&local_3f8);
          ::std::__cxx11::string::~string((string *)&type.member_name_cache._M_h._M_single_bucket);
        }
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      to_expression_abi_cxx11_(&local_2b8,this,args->coord,true);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2b8);
      ::std::__cxx11::string::~string((string *)&local_2b8);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      to_expression_abi_cxx11_(&local_2d8,this,args->dref,true);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2d8);
      ::std::__cxx11::string::~string((string *)&local_2d8);
    }
  }
  if ((args->grad_x != 0) || (args->grad_y != 0)) {
    local_8ea = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_8ea = should_forward(this,args->grad_x);
    }
    swizzle_expr._5_1_ = local_8ea;
    local_8ec = false;
    if (local_8ea != false) {
      local_8ec = should_forward(this,args->grad_y);
    }
    swizzle_expr._5_1_ = local_8ec;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    to_expression_abi_cxx11_(&local_758,this,args->grad_x,true);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_758);
    ::std::__cxx11::string::~string((string *)&local_758);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    to_expression_abi_cxx11_(&local_778,this,args->grad_y,true);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_778);
    ::std::__cxx11::string::~string((string *)&local_778);
  }
  if (args->lod == 0) {
    if (((((args->base).is_fetch & 1U) != 0) && ((local_38->image).dim != Buffer)) &&
       (((local_38->image).ms & 1U) == 0)) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", 0");
    }
  }
  else if ((local_291 & 1) == 0) {
    local_8ee = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_8ee = should_forward(this,args->lod);
    }
    swizzle_expr._5_1_ = local_8ee;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    if (((((args->base).is_fetch & 1U) == 0) || ((local_38->image).dim == Buffer)) ||
       (((local_38->image).ms & 1U) != 0)) {
      to_expression_abi_cxx11_(&local_7b8,this,args->lod,true);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7b8);
      ::std::__cxx11::string::~string((string *)&local_7b8);
    }
    else {
      bitcast_expression_abi_cxx11_(&local_798,this,Int,args->lod);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_798);
      ::std::__cxx11::string::~string((string *)&local_798);
    }
  }
  else if ((local_38->image).dim == Dim2D) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", vec2(0.0), vec2(0.0)");
  }
  else if ((local_38->image).dim == Cube) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", vec3(0.0), vec3(0.0)");
  }
  if (args->offset != 0) {
    local_8f0 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      local_8f0 = should_forward(this,args->offset);
    }
    swizzle_expr._5_1_ = local_8f0;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    bitcast_expression_abi_cxx11_(&local_7d8,this,Int,args->offset);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7d8);
    ::std::__cxx11::string::~string((string *)&local_7d8);
  }
  if (args->sample != 0) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    bitcast_expression_abi_cxx11_(&local_7f8,this,Int,args->sample);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7f8);
    ::std::__cxx11::string::~string((string *)&local_7f8);
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    to_expression_abi_cxx11_(&local_818,this,args->min_lod,true);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_818);
    ::std::__cxx11::string::~string((string *)&local_818);
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    to_expression_abi_cxx11_(&local_838,this,args->sparse_texel,true);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_838);
    ::std::__cxx11::string::~string((string *)&local_838);
  }
  if (args->bias != 0) {
    bVar1 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      bVar1 = should_forward(this,args->bias);
    }
    swizzle_expr._5_1_ = bVar1;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    to_expression_abi_cxx11_(&local_858,this,args->bias,true);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_858);
    ::std::__cxx11::string::~string((string *)&local_858);
  }
  if ((args->component != 0) && (bVar1 = expression_is_constant_null(this,args->component), !bVar1))
  {
    bVar1 = false;
    if ((swizzle_expr._5_1_ & 1) != 0) {
      bVar1 = should_forward(this,args->component);
    }
    swizzle_expr._5_1_ = bVar1;
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    bitcast_expression_abi_cxx11_(&local_878,this,Int,args->component);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_878);
    ::std::__cxx11::string::~string((string *)&local_878);
  }
  *pbStack_28 = (bool)(swizzle_expr._5_1_ & 1);
  local_39 = 1;
  ::std::__cxx11::string::~string((string *)local_e0);
  if ((local_39 & 1) == 0) {
    ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_non_uniform_aware_expression(img);

	if (args.nonuniform_expression && farg_str.find_first_of('[') != string::npos)
	{
		// Only emit nonuniformEXT() wrapper if the underlying expression is arrayed in some way.
		farg_str = join(backend.nonuniform_qualifier, "(", farg_str, ")");
	}

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, img) && args.lod != 0 && !args.base.is_fetch;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			if (imgtype.image.dim == Dim1D && options.es)
				type.vecsize++;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";

			if (imgtype.image.dim == Dim1D && options.es)
			{
				if (imgtype.image.arrayed)
				{
					farg_str += enclose_expression(coord_expr) + ".x";
					farg_str += ", 0.0, ";
					farg_str += enclose_expression(coord_expr) + ".y";
				}
				else
				{
					farg_str += coord_expr;
					farg_str += ", 0.0";
				}
			}
			else
				farg_str += coord_expr;

			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		if (imgtype.image.dim == Dim1D && options.es)
		{
			// Have to fake a second coordinate.
			if (type_is_floating_point(coord_type))
			{
				// Cannot mix proj and array.
				if (imgtype.image.arrayed || args.base.is_proj)
				{
					coord_expr = join("vec3(", enclose_expression(coord_expr), ".x, 0.0, ",
					                  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("vec2(", coord_expr, ", 0.0)");
			}
			else
			{
				if (imgtype.image.arrayed)
				{
					coord_expr = join("ivec3(", enclose_expression(coord_expr),
									  ".x, 0, ",
									  enclose_expression(coord_expr), ".y)");
				}
				else
					coord_expr = join("ivec2(", coord_expr, ", 0)");
			}
		}

		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			forward = forward && should_forward(args.lod);
			farg_str += ", ";

			// Lod expression for TexelFetch in GLSL must be int, and only int.
			if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
				farg_str += bitcast_expression(SPIRType::Int, args.lod);
			else
				farg_str += to_expression(args.lod);
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component && !expression_is_constant_null(args.component))
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += bitcast_expression(SPIRType::Int, args.component);
	}

	*p_forward = forward;

	return farg_str;
}